

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> *
kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>
          (SourceLocation location)

{
  SourceLocation location_00;
  RefOrVoid<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>_> params;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  Client *pCVar1;
  OwnPromiseNode *node_00;
  Promise<capnproto_test::capnp::test::TestInterface::Client> *pPVar2;
  Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
  *other;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> *in_RDI;
  undefined8 in_stack_00000008;
  void *local_50;
  Promise<capnproto_test::capnp::test::TestInterface::Client> promise;
  Own<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  OwnPromiseNode intermediate;
  Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
  wrapper;
  
  _::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>::make();
  params = Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
           ::operator*((Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
                        *)&intermediate);
  _::
  allocPromise<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>>,kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>&>
            ((_ *)&local_30,params);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Own<kj::_::AdapterPromiseNode<capnproto_test::capnp::test::TestInterface::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestInterface::Client>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(&local_28);
  local_50 = (void *)0x0;
  pCVar1 = implicitCast<capnproto_test::capnp::test::TestInterface::Client*,decltype(nullptr)>
                     (&local_50);
  unique0x10000217 = location;
  location_00.fileName = (char *)in_stack_00000008;
  location_00._16_8_ = location.function;
  node_00 = _::maybeChain<capnproto_test::capnp::test::TestInterface::Client>
                      (node,pCVar1,location_00);
  _::PromiseNode::to<kj::Promise<capnproto_test::capnp::test::TestInterface::Client>>
            ((PromiseNode *)&stack0xffffffffffffffb8,node_00);
  pPVar2 = mv<kj::Promise<capnproto_test::capnp::test::TestInterface::Client>>
                     ((Promise<capnproto_test::capnp::test::TestInterface::Client> *)
                      &stack0xffffffffffffffb8);
  Promise<capnproto_test::capnp::test::TestInterface::Client>::Promise(&in_RDI->promise,pPVar2);
  other = mv<kj::Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,decltype(nullptr)>>
                    ((Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
                      *)&intermediate);
  Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>,decltype(nullptr)>::
  Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,void>
            ((Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>,decltype(nullptr)>
              *)&in_RDI->fulfiller,other);
  Promise<capnproto_test::capnp::test::TestInterface::Client>::~Promise
            ((Promise<capnproto_test::capnp::test::TestInterface::Client> *)&stack0xffffffffffffffb8
            );
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>::
  ~Own((Own<kj::_::WeakFulfiller<capnproto_test::capnp::test::TestInterface::Client>,_std::nullptr_t>
        *)&intermediate);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}